

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bit.hpp
# Opt level: O0

string * duckdb::Bit::NumericToBit<signed_char>(char numeric)

{
  pointer data;
  string *in_RDI;
  bitstring_t output_str;
  unique_ptr<char[],_std::default_delete<char>,_false> buffer;
  unsigned_long bit_len;
  string *output_str_00;
  undefined1 *puVar1;
  string_t *in_stack_ffffffffffffffc0;
  string_t *in_stack_ffffffffffffffd8;
  undefined1 local_20 [8];
  unsigned_long local_18;
  
  local_18 = 2;
  puVar1 = local_20;
  output_str_00 = in_RDI;
  make_unsafe_uniq_array_uninitialized<char>((size_t)in_RDI);
  data = ::std::unique_ptr<char[],_std::default_delete<char[]>_>::get
                   ((unique_ptr<char[],_std::default_delete<char[]>_> *)in_RDI);
  UnsafeNumericCast<unsigned_int,unsigned_long,void>(local_18);
  string_t::string_t(in_stack_ffffffffffffffc0,data,(uint32_t)((ulong)puVar1 >> 0x20));
  NumericToBit<signed_char>((char)((ulong)puVar1 >> 0x38),(bitstring_t *)output_str_00);
  string_t::GetString_abi_cxx11_(in_stack_ffffffffffffffd8);
  unique_ptr<char[],_std::default_delete<char>,_false>::~unique_ptr
            ((unique_ptr<char[],_std::default_delete<char>,_false> *)0x10ddcf2);
  return output_str_00;
}

Assistant:

string Bit::NumericToBit(T numeric) {
	auto bit_len = sizeof(T) + 1;
	auto buffer = make_unsafe_uniq_array_uninitialized<char>(bit_len);
	bitstring_t output_str(buffer.get(), UnsafeNumericCast<uint32_t>(bit_len));
	Bit::NumericToBit(numeric, output_str);
	return output_str.GetString();
}